

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall Clasp::ClaspConfig::ClaspConfig(ClaspConfig *this)

{
  Impl *pIVar1;
  
  BasicSatConfig::BasicSatConfig(&this->super_BasicSatConfig);
  (this->super_BasicSatConfig).super_UserConfiguration.super_Configuration._vptr_Configuration =
       (_func_int **)&PTR__ClaspConfig_001e8100;
  *(undefined4 *)&(this->solve).super_ParallelSolveOptions.super_BasicSolveOptions.limit.conflicts =
       0xffffffff;
  *(undefined4 *)
   ((long)&(this->solve).super_ParallelSolveOptions.super_BasicSolveOptions.limit.conflicts + 4) =
       0xffffffff;
  *(undefined4 *)&(this->solve).super_ParallelSolveOptions.super_BasicSolveOptions.limit.restarts =
       0xffffffff;
  *(undefined4 *)
   ((long)&(this->solve).super_ParallelSolveOptions.super_BasicSolveOptions.limit.restarts + 4) =
       0xffffffff;
  (this->solve).super_ParallelSolveOptions.integrate = (Integration)0x10000400;
  (this->solve).super_ParallelSolveOptions.distribute.super_Policy = (Policy)0x0;
  *(undefined8 *)&(this->solve).super_ParallelSolveOptions.distribute.mode = 0;
  ScheduleStrategy::ScheduleStrategy
            (&(this->solve).super_ParallelSolveOptions.restarts.sched,Geometric,100,1.5,0);
  (this->solve).super_ParallelSolveOptions.algorithm.threads = 1;
  (this->solve).super_ParallelSolveOptions.algorithm.mode = mode_compete;
  (this->solve).super_EnumOptions.numModels = -1;
  (this->solve).super_EnumOptions.enumMode = enum_auto;
  (this->solve).super_EnumOptions.optMode = optimize;
  (this->solve).super_EnumOptions.optStop.ebo_.size = 0;
  (this->solve).super_EnumOptions.optStop.ebo_.cap = 0;
  this->asp = (AspOptions)0x0;
  (this->solve).super_EnumOptions.proMode = Implicit;
  (this->solve).super_EnumOptions.project = 0;
  (this->solve).super_EnumOptions.optBound.ebo_.buf = (pointer)0x0;
  (this->solve).super_EnumOptions.optBound.ebo_.size = 0;
  (this->solve).super_EnumOptions.optBound.ebo_.cap = 0;
  (this->solve).super_EnumOptions.optStop.ebo_.buf = (pointer)0x0;
  *(uint *)&(this->asp).field_0x4 = *(uint *)&(this->asp).field_0x4 & 0xfc000000 | 5;
  (this->parse).set = '\0';
  this->tester_ = (UserConfig *)0x0;
  pIVar1 = (Impl *)operator_new(0x40);
  (pIVar1->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pIVar1->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(pIVar1->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pIVar1->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  pIVar1->acycSet = 0;
  (pIVar1->mutex).super___mutex_base._M_mutex.__align = 0;
  (pIVar1->pp).ebo_.buf = (pointer)0x0;
  (pIVar1->pp).ebo_.size = 0;
  (pIVar1->pp).ebo_.cap = 0;
  this->impl_ = pIVar1;
  return;
}

Assistant:

ClaspConfig::ClaspConfig() : tester_(0), impl_(new Impl()) {}